

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::MapReadWriteTest::iterate(MapReadWriteTest *this)

{
  ostringstream *poVar1;
  PFNGLNAMEDBUFFERDATA p_Var2;
  PFNGLMAPNAMEDBUFFER p_Var3;
  PFNGLUNMAPNAMEDBUFFER p_Var4;
  bool bVar5;
  bool bVar6;
  GLboolean GVar7;
  int iVar8;
  ContextType ctxType;
  deUint32 dVar9;
  undefined4 extraout_var;
  undefined4 *puVar11;
  long lVar12;
  int *piVar13;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint buffer;
  GLuint local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar10;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar5) || (bVar6)) {
    local_1b4 = 0;
    p_Var2 = *(PFNGLNAMEDBUFFERDATA *)(lVar10 + 0xec0);
    this->m_pNamedBufferData = p_Var2;
    p_Var3 = *(PFNGLMAPNAMEDBUFFER *)(lVar10 + 0xd08);
    this->m_pMapNamedBuffer = p_Var3;
    p_Var4 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar10 + 0x1678);
    this->m_pUnmapNamedBuffer = p_Var4;
    if ((p_Var2 == (PFNGLNAMEDBUFFERDATA)0x0) ||
       ((p_Var3 == (PFNGLMAPNAMEDBUFFER)0x0 || (p_Var4 == (PFNGLUNMAPNAMEDBUFFER)0x0)))) {
      puVar11 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar11 = 0;
      __cxa_throw(puVar11,&int::typeinfo,0);
    }
    (**(code **)(lVar10 + 0x3b8))(1,&local_1b4);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x539);
    (*this->m_pNamedBufferData)(local_1b4,0x34,&s_reference,0x88ea);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glNamedBufferData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x53d);
    puVar11 = (undefined4 *)(*this->m_pMapNamedBuffer)(local_1b4,0x88ba);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glMapNamedBuffer failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x541);
    if (puVar11 == (undefined4 *)0x0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "glMapNamedBuffer returned NULL pointer, but buffer\'s data was expected.",0x47);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar5 = true;
    }
    else {
      bVar5 = true;
      lVar12 = 0;
      do {
        bVar5 = (bool)(bVar5 & *(int *)((long)puVar11 + lVar12) ==
                               *(int *)((long)&s_reference + lVar12));
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x34);
      if (!bVar5) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glMapNamedBuffer returned pointer to data which is not identical to reference data."
                   ,0x53);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      lVar12 = 0xc;
      do {
        *puVar11 = (&s_reference)[lVar12];
        puVar11 = puVar11 + 1;
        bVar6 = lVar12 != 0;
        lVar12 = lVar12 + -1;
      } while (bVar6);
      GVar7 = (*this->m_pUnmapNamedBuffer)(local_1b4);
      if (GVar7 != '\x01') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glUnmapNamedBuffer called on mapped buffer has returned GL_FALSE, but GL_TRUE was expected."
                   ,0x5b);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = false;
      }
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x56c);
      piVar13 = (int *)(*this->m_pMapNamedBuffer)(local_1b4,0x88ba);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glMapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x571);
      if (piVar13 == (int *)0x0) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glMapNamedBuffer returned NULL pointer, but buffer\'s data was expected.",0x47);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      else {
        lVar12 = 0xc;
        do {
          bVar5 = (bool)(bVar5 & *piVar13 == (&s_reference)[lVar12]);
          piVar13 = piVar13 + 1;
          bVar6 = lVar12 != 0;
          lVar12 = lVar12 + -1;
        } while (bVar6);
        GVar7 = (*this->m_pUnmapNamedBuffer)(local_1b4);
        if (GVar7 != '\x01') {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "glUnmapNamedBuffer called on mapped buffer has returned GL_FALSE, but GL_TRUE was expected."
                     ,0x5b);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar5 = false;
        }
        dVar9 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar9,"glUnmapNamedBuffer failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                        ,0x58e);
      }
    }
    if (local_1b4 != 0) {
      (**(code **)(lVar10 + 0x438))(1);
      local_1b4 = 0;
    }
    do {
      iVar8 = (**(code **)(lVar10 + 0x800))();
    } while (iVar8 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar5) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapReadWriteTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferData  = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pMapNamedBuffer   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pUnmapNamedBuffer = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Buffer creation. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		/* Buffer's storage allocation and reference data upload. */
		m_pNamedBufferData(buffer, s_reference_size, s_reference, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

		/* Mapping with new named buffer map function. */
		glw::GLuint* data = (glw::GLuint*)m_pMapNamedBuffer(buffer, GL_READ_WRITE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

		if (DE_NULL == data)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glMapNamedBuffer returned NULL pointer, but buffer's data was expected."
				<< tcu::TestLog::EndMessage;
		}
		else
		{
			/* Comparison results with reference data. */
			for (glw::GLsizei i = 0; i < s_reference_count; ++i)
			{
				is_ok &= (data[i] == s_reference[i]);
			}

			if (!is_ok)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBuffer returned pointer to data which is not identical to reference data."
					<< tcu::TestLog::EndMessage;
			}

			/* Writting inverted reference data. */
			for (glw::GLsizei i = 0; i < s_reference_count; ++i)
			{
				data[i] = s_reference[s_reference_count - i - 1];
			}

			/* Unmapping with new named buffer unmap function. */
			if (GL_TRUE != m_pUnmapNamedBuffer(buffer))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glUnmapNamedBuffer called on mapped buffer has returned GL_FALSE, but GL_TRUE was expected."
					<< tcu::TestLog::EndMessage;
			}
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			data = DE_NULL;

			data = (glw::GLuint*)m_pMapNamedBuffer(buffer, GL_READ_WRITE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			if (DE_NULL == data)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBuffer returned NULL pointer, but buffer's data was expected."
					<< tcu::TestLog::EndMessage;
			}
			else
			{
				/* Comparison results with inverted reference data. */
				for (glw::GLsizei i = 0; i < s_reference_count; ++i)
				{
					is_ok &= (data[i] == s_reference[s_reference_count - i - 1]);
				}

				/* Unmapping with new named buffer unmap function. */
				if (GL_TRUE != m_pUnmapNamedBuffer(buffer))
				{
					is_ok = false;

					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message
						<< "glUnmapNamedBuffer called on mapped buffer has returned GL_FALSE, but GL_TRUE was expected."
						<< tcu::TestLog::EndMessage;
				}
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = false;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}